

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewChange.h
# Opt level: O1

void __thiscall
NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::WriteInIndexFile(NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fileName
                  ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fileHash)

{
  char cVar1;
  long *plVar2;
  ostream *poVar3;
  Logger *pLVar4;
  long *plVar5;
  size_type *psVar6;
  ofstream index;
  allocator<char> local_2a9;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  string local_248;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,(this->path->_M_dataplus)._M_p,&local_2a9);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_288);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_298 = *plVar5;
    lStack_290 = plVar2[3];
    local_2a8 = &local_298;
  }
  else {
    local_298 = *plVar5;
    local_2a8 = (long *)*plVar2;
  }
  local_2a0 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::ofstream::ofstream(&local_228,(string *)&local_2a8,_S_app);
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"add",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_228,(fileHash->_M_dataplus)._M_p,fileHash->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(fileName->_M_dataplus)._M_p,fileName->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    pLVar4 = Logger::getInstance();
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"Can\'t create new line","");
    Logger::LogError(pLVar4,&local_248);
    local_288._M_dataplus._M_p = local_248._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p == &local_248.field_2) goto LAB_0010808f;
  }
  else {
    pLVar4 = Logger::getInstance();
    std::operator+(&local_288,"New line in Index file - add",fileHash);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_288);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_298 = *plVar5;
      lStack_290 = plVar2[3];
      local_2a8 = &local_298;
    }
    else {
      local_298 = *plVar5;
      local_2a8 = (long *)*plVar2;
    }
    local_2a0 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_2a8,(ulong)(fileName->_M_dataplus)._M_p);
    psVar6 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_268.field_2._M_allocated_capacity = *psVar6;
      local_268.field_2._8_8_ = plVar2[3];
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar6;
      local_268._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_268._M_string_length = plVar2[1];
    *plVar2 = (long)psVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    Logger::LogInformation(pLVar4,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    local_248.field_2._M_allocated_capacity = local_288.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p == &local_288.field_2) goto LAB_0010808f;
  }
  operator_delete(local_288._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
LAB_0010808f:
  std::ofstream::close();
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

virtual void WriteInIndexFile(T fileName, T fileHash) {
        ofstream index(string(this->path->data()) + "/Index", ios_base::app);

        index << "add" << " " << fileHash << " " << fileName << endl;

        if (index.is_open()) {
            Logger::getInstance()->LogInformation("New line in Index file - add" + fileHash + " " + fileName);
        } else {
            Logger::getInstance()->LogError("Can't create new line");
        }

        index.close();
    }